

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_queue.c
# Opt level: O0

int setOption(void *handle,char *name,void *value)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  int result;
  void *value_local;
  char *name_local;
  void *handle_local;
  
  if (((handle == (void *)0x0) || (name == (char *)0x0)) || (value == (void *)0x0)) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/message_queue.c"
                ,"setOption",0x27d,1,"invalid argument (handle=%p, name=%p, value=%p)",handle,name,
                value);
    }
    l._4_4_ = 0x27e;
  }
  else {
    iVar1 = strcmp(SAVED_OPTION_MAX_ENQUEUE_TIME_SECS,name);
    if (iVar1 == 0) {
      iVar1 = message_queue_set_max_message_enqueued_time_secs((MESSAGE_QUEUE_HANDLE)handle,*value);
      if (iVar1 == 0) {
        l._4_4_ = 0;
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/message_queue.c"
                    ,"setOption",0x284,1,"failed setting option %s",name);
        }
        l._4_4_ = 0x285;
      }
    }
    else {
      iVar1 = strcmp(SAVED_OPTION_MAX_PROCESSING_TIME_SECS,name);
      if (iVar1 == 0) {
        iVar1 = message_queue_set_max_message_processing_time_secs
                          ((MESSAGE_QUEUE_HANDLE)handle,*value);
        if (iVar1 == 0) {
          l._4_4_ = 0;
        }
        else {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/message_queue.c"
                      ,"setOption",0x290,1,"failed setting option %s",name);
          }
          l._4_4_ = 0x291;
        }
      }
      else {
        iVar1 = strcmp(SAVED_OPTION_MAX_RETRY_COUNT,name);
        if (iVar1 == 0) {
          iVar1 = message_queue_set_max_retry_count((MESSAGE_QUEUE_HANDLE)handle,*value);
          if (iVar1 == 0) {
            l._4_4_ = 0;
          }
          else {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/message_queue.c"
                        ,"setOption",0x29c,1,"failed setting option %s",name);
            }
            l._4_4_ = 0x29d;
          }
        }
        else {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/message_queue.c"
                      ,"setOption",0x2a6,1,"option %s is invalid",name);
          }
          l._4_4_ = 0x2a7;
        }
      }
    }
  }
  return l._4_4_;
}

Assistant:

static int setOption(void* handle, const char* name, const void* value)
{
    int result;

    if (handle == NULL || name == NULL || value == NULL)
    {
        LogError("invalid argument (handle=%p, name=%p, value=%p)", handle, name, value);
        result = MU_FAILURE;
    }
    else if (strcmp(SAVED_OPTION_MAX_ENQUEUE_TIME_SECS, name) == 0)
    {
        if (message_queue_set_max_message_enqueued_time_secs((MESSAGE_QUEUE_HANDLE)handle, *(size_t*)value) != RESULT_OK)
        {
            LogError("failed setting option %s", name);
            result = MU_FAILURE;
        }
        else
        {
            result = RESULT_OK;
        }
    }
    else if (strcmp(SAVED_OPTION_MAX_PROCESSING_TIME_SECS, name) == 0)
    {
        if (message_queue_set_max_message_processing_time_secs((MESSAGE_QUEUE_HANDLE)handle, *(size_t*)value) != RESULT_OK)
        {
            LogError("failed setting option %s", name);
            result = MU_FAILURE;
        }
        else
        {
            result = RESULT_OK;
        }
    }
    else if (strcmp(SAVED_OPTION_MAX_RETRY_COUNT, name) == 0)
    {
        if (message_queue_set_max_retry_count((MESSAGE_QUEUE_HANDLE)handle, *(size_t*)value) != RESULT_OK)
        {
            LogError("failed setting option %s", name);
            result = MU_FAILURE;
        }
        else
        {
            result = RESULT_OK;
        }
    }
    else
    {
        LogError("option %s is invalid", name);
        result = MU_FAILURE;
    }

    return result;
}